

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

void Cec_ManPatComputePattern2_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vPat)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  Gia_Obj_t *pObj_00;
  
  while( true ) {
    iVar4 = Gia_ObjIsTravIdCurrent(p,pObj);
    if (iVar4 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar3 = *(ulong *)pObj;
    uVar5 = (uint)uVar3;
    if ((~uVar5 & 0x9fffffff) == 0) break;
    if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                    ,0xda,
                    "void Cec_ManPatComputePattern2_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    pObj_00 = pObj + -(ulong)(uVar5 & 0x1fffffff);
    if ((uVar3 & 0x4000000000000000) == 0) {
      uVar5 = (uint)(uVar3 >> 0x20);
      uVar6 = (ulong)(uVar5 & 0x1fffffff);
      if (((((uint)(uVar3 >> 0x1d) & 7 ^ (uint)((ulong)*(undefined8 *)pObj_00 >> 0x3e)) & 1) != 0)
         && (((uVar5 >> 0x1d ^ (uint)((ulong)*(undefined8 *)(pObj + -uVar6) >> 0x3e)) & 1) != 0)) {
        __assert_fail("(Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 || (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                      ,0xe3,
                      "void Cec_ManPatComputePattern2_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      pGVar1 = pObj + -uVar6;
      pGVar2 = pObj + -uVar6;
      pObj = pObj_00;
      if (((uVar5 >> 0x1d ^ (uint)((ulong)*(undefined8 *)pGVar2 >> 0x3e)) & 1) == 0) {
        pObj = pGVar1;
      }
    }
    else {
      Cec_ManPatComputePattern2_rec(p,pObj_00,vPat);
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    }
  }
  iVar4 = Gia_ObjCioId(pObj);
  Vec_IntPush(vPat,(uint)(((undefined1  [12])*pObj & (undefined1  [12])0x4000000000000000) ==
                         (undefined1  [12])0x0) + iVar4 * 2);
  return;
}

Assistant:

void Cec_ManPatComputePattern2_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vPat )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPat, Abc_Var2Lit( Gia_ObjCioId(pObj), pObj->fMark1==0 ) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( pObj->fMark1 == 1 )
    {
        Cec_ManPatComputePattern2_rec( p, Gia_ObjFanin0(pObj), vPat );
        Cec_ManPatComputePattern2_rec( p, Gia_ObjFanin1(pObj), vPat );
    }
    else
    {
        assert( (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) == 0 ||
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0 );
        if ( (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj)) == 0 )
            Cec_ManPatComputePattern2_rec( p, Gia_ObjFanin1(pObj), vPat );
        else
            Cec_ManPatComputePattern2_rec( p, Gia_ObjFanin0(pObj), vPat );
    }
}